

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.h
# Opt level: O0

bool __thiscall
MemFile::read<std::vector<char,std::allocator<char>>>
          (MemFile *this,vector<char,_std::allocator<char>_> *buf)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  char *__dest;
  reference __src;
  int total_size;
  vector<char,_std::allocator<char>_> *buf_local;
  MemFile *this_local;
  
  sVar3 = std::vector<char,_std::allocator<char>_>::size(buf);
  iVar1 = (int)sVar3;
  iVar2 = remaining(this);
  if (iVar1 <= iVar2) {
    __dest = std::vector<char,_std::allocator<char>_>::data(buf);
    __src = __gnu_cxx::
            __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator*(&this->m_it);
    memcpy(__dest,__src,(long)iVar1);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&this->m_it,(long)iVar1);
  }
  return iVar1 <= iVar2;
}

Assistant:

bool read(T& buf)
    {
        auto total_size = static_cast<int>(sizeof(buf[0]) * buf.size());

        // Fail if we can't fill the target
        if (remaining() < total_size)
            return false;

        std::memcpy(buf.data(), &*m_it, total_size);
        //  std::copy(m_it, m_it + size, buf.data());
        m_it += total_size;
        return true;
    }